

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucitest.cc
# Opt level: O1

void __thiscall UciTest_parseMovesA2A3A7A6_Test::TestBody(UciTest_parseMovesA2A3A7A6_Test *this)

{
  Board *pos;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  initializer_list<std::pair<const_board::Square,_board::Piece>_> __l;
  initializer_list<std::pair<const_board::Square,_board::Piece>_> __l_00;
  allocator_type local_9a;
  less<board::Square> local_99;
  string local_98;
  _Rb_tree<board::Square,_std::pair<const_board::Square,_board::Piece>,_std::_Select1st<std::pair<const_board::Square,_board::Piece>_>,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  local_78;
  _Rb_tree<board::Square,_std::pair<const_board::Square,_board::Piece>,_std::_Select1st<std::pair<const_board::Square,_board::Piece>_>,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  local_48;
  
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"moves a2a3","");
  pos = &(this->super_UciTest).super_BoardTest.pos;
  io::uci::parsePosition(&local_98,pos);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)0x100000029;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_98;
  std::
  map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  ::map((map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
         *)&local_48,__l,&local_99,&local_9a);
  test::BoardTest::ASSERT_BOARD
            ((BoardTest *)this,pos,
             (map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
              *)&local_48,BLACK,NO_SQ,0,0xf);
  std::
  _Rb_tree<board::Square,_std::pair<const_board::Square,_board::Piece>,_std::_Select1st<std::pair<const_board::Square,_board::Piece>_>,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  ::~_Rb_tree(&local_48);
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"moves a7a6","");
  io::uci::parsePosition(&local_98,pos);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)0x100000029;
  local_98._M_string_length = 0x700000047;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_98;
  std::
  map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  ::map((map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
         *)&local_78,__l_00,&local_99,&local_9a);
  test::BoardTest::ASSERT_BOARD
            ((BoardTest *)this,pos,
             (map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
              *)&local_78,WHITE,NO_SQ,0,0xf);
  std::
  _Rb_tree<board::Square,_std::pair<const_board::Square,_board::Piece>,_std::_Select1st<std::pair<const_board::Square,_board::Piece>_>,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
  ::~_Rb_tree(&local_78);
  return;
}

Assistant:

TEST_F(UciTest, parseMovesA2A3A7A6)
{
    io::uci::parsePosition("moves a2a3", pos);

    ASSERT_BOARD(pos,
                 {
                     {board::A3, board::WP},
                 },
                 board::BLACK, board::NO_SQ, 0);

    io::uci::parsePosition("moves a7a6", pos);

    ASSERT_BOARD(pos,
                 {
                     {board::A3, board::WP},
                     {board::A6, board::BP},
                 },
                 board::WHITE, board::NO_SQ, 0);
}